

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMul<(moira::Instr)81,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 in_EAX;
  u32 uVar2;
  ulong uVar3;
  u32 data;
  u32 ea;
  u32 local_18;
  u32 local_14;
  
  local_18 = in_EAX;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>(this,opcode & 7,&local_14,&local_18);
  if (bVar1) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    prefetch<4ul>(this);
    uVar2 = mul<(moira::Instr)81>
                      (this,local_18,(uint)*(ushort *)((long)this->exec + uVar3 * 4 + -0x58));
    *(u32 *)((long)this->exec + uVar3 * 4 + -0x58) = uVar2;
  }
  return;
}

Assistant:

void
Moira::execMul(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execMulMusashi<I, M, S>(opcode);
        return;
    }

    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    result = mul<I>(data, readD<Word>(dst));
    
    writeD(dst, result);
}